

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestChildExtension::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  string_view value;
  string_view value_00;
  uint uVar1;
  TestChildExtension *pTVar2;
  TestChildExtension **v1;
  TestChildExtension **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  uint32_t *puVar4;
  Arena *pAVar5;
  TestAllExtensions *pTVar6;
  LogMessage local_110;
  Voidify local_f9;
  string_view local_f8;
  string_view local_e8;
  uint local_d8;
  uint32_t cached_has_bits;
  LogMessage local_c8;
  Voidify local_b1;
  TestChildExtension *local_b0;
  Nullable<const_char_*> local_a8;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestChildExtension *from;
  TestChildExtension *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_70;
  size_t local_68;
  char *local_60;
  TestChildExtension *local_58;
  size_t local_50;
  char *local_48;
  anon_union_32_1_493b367e_for_TestChildExtension_3 *local_40;
  size_t local_38;
  char *local_30;
  TestChildExtension *local_28;
  size_t local_20;
  char *local_18;
  anon_union_32_1_493b367e_for_TestChildExtension_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (TestChildExtension *)to_msg;
  _this = (TestChildExtension *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_b0 = (TestChildExtension *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestChildExtension_const*>(&local_b0);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestChildExtension*>(&from);
  local_a8 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestChildExtension_const*,edition_unittest::TestChildExtension*>
                       (v1,v2,"&from != _this");
  if (local_a8 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_a8);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x38d2,failure_msg);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_b1,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_c8);
  }
  local_d8 = 0;
  puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  pTVar2 = from;
  local_d8 = *puVar4;
  if ((local_d8 & 7) != 0) {
    if ((local_d8 & 1) != 0) {
      local_e8 = _internal_a((TestChildExtension *)arena);
      local_50 = local_e8._M_len;
      local_48 = local_e8._M_str;
      local_58 = pTVar2;
      local_40 = &pTVar2->field_0;
      puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      *puVar4 = *puVar4 | 1;
      local_68 = local_50;
      local_60 = local_48;
      pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      value._M_str = local_60;
      value._M_len = local_68;
      google::protobuf::internal::ArenaStringPtr::Set(&(pTVar2->field_0)._impl_.a_,value,pAVar5);
    }
    pTVar2 = from;
    if ((local_d8 & 2) != 0) {
      local_f8 = _internal_b((TestChildExtension *)arena);
      local_20 = local_f8._M_len;
      local_18 = local_f8._M_str;
      local_28 = pTVar2;
      local_10 = &pTVar2->field_0;
      puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      *puVar4 = *puVar4 | 2;
      local_38 = local_20;
      local_30 = local_18;
      pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      value_00._M_str = local_30;
      value_00._M_len = local_38;
      google::protobuf::internal::ArenaStringPtr::Set(&(pTVar2->field_0)._impl_.b_,value_00,pAVar5);
    }
    if ((local_d8 & 4) != 0) {
      if ((arena->impl_).first_owner_ == (void *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_110,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x38df,"from._impl_.optional_extension_ != nullptr");
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_110);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_f9,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_110);
      }
      if ((from->field_0)._impl_.optional_extension_ == (TestAllExtensions *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_owner_;
        local_70 = absl_log_internal_check_op_result;
        pTVar6 = (TestAllExtensions *)
                 google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllExtensions>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.optional_extension_ = pTVar6;
      }
      else {
        TestAllExtensions::MergeFrom
                  ((from->field_0)._impl_.optional_extension_,
                   (TestAllExtensions *)(arena->impl_).first_owner_);
      }
    }
  }
  uVar1 = local_d8;
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar4 = uVar1 | *puVar4;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestChildExtension::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestChildExtension*>(&to_msg);
  auto& from = static_cast<const TestChildExtension&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestChildExtension)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_a(from._internal_a());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_b(from._internal_b());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.optional_extension_ != nullptr);
      if (_this->_impl_.optional_extension_ == nullptr) {
        _this->_impl_.optional_extension_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_extension_);
      } else {
        _this->_impl_.optional_extension_->MergeFrom(*from._impl_.optional_extension_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}